

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http-test.c++
# Opt level: O0

void kj::anon_unknown_0::testHttpClient
               (WaitScope *waitScope,HttpHeaderTable *table,HttpClient *client,
               HttpTestCase *testCase)

{
  HttpMethod HVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  bool bVar4;
  InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase> *this;
  HeaderTestCase *pHVar5;
  InitializeableArray<kj::StringPtr> *this_00;
  StringPtr *pSVar6;
  AsyncOutputStream *pAVar7;
  char *pcVar8;
  size_t sVar9;
  AsyncInputStream *limit;
  HttpHeaderId id;
  bool local_249;
  undefined1 local_248 [7];
  bool _kj_shouldLog_2;
  StringPtr local_230;
  bool local_219;
  undefined1 local_218 [7];
  bool _kj_shouldLog_1;
  Promise<kj::String> local_208;
  undefined1 local_1f8 [8];
  String body;
  undefined1 local_1d8 [7];
  bool _kj_shouldLog;
  Response response;
  StringPtr *part;
  StringPtr *__end2_1;
  StringPtr *__begin2_1;
  InitializeableArray<kj::StringPtr> *__range2_1;
  char *local_168;
  size_t sStack_160;
  undefined1 local_158 [8];
  Request request;
  HeaderTestCase *header;
  HeaderTestCase *__end2;
  HeaderTestCase *__begin2;
  InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase> *__range2;
  undefined1 local_e0 [8];
  HttpHeaders headers;
  ContextImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_compat_http_test_c__:536:3)>
  _kjContext536;
  anon_class_8_1_a389c060 _kjContextFunc536;
  HttpTestCase *testCase_local;
  HttpClient *client_local;
  HttpHeaderTable *table_local;
  WaitScope *waitScope_local;
  
  _kjContext536.func = (anon_class_8_1_a389c060 *)testCase;
  _::Debug::
  ContextImpl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++:536:3)>
  ::ContextImpl((ContextImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_compat_http_test_c__:536:3)>
                 *)&headers.ownedStrings.builder.disposer,
                (anon_class_8_1_a389c060 *)&_kjContext536.func);
  HttpHeaders::HttpHeaders((HttpHeaders *)local_e0,table);
  this = &(testCase->request).requestHeaders;
  __end2 = Array<kj::(anonymous_namespace)::HeaderTestCase>::begin
                     (&this->super_Array<kj::(anonymous_namespace)::HeaderTestCase>);
  pHVar5 = Array<kj::(anonymous_namespace)::HeaderTestCase>::end
                     (&this->super_Array<kj::(anonymous_namespace)::HeaderTestCase>);
  for (; __end2 != pHVar5; __end2 = __end2 + 1) {
    uVar2 = (__end2->id).table;
    uVar3 = (__end2->id).id;
    id.id = uVar3;
    id.table = (HttpHeaderTable *)uVar2;
    request.response.super_PromiseBase.node.ptr = (PromiseNode *)(__end2->value).content.ptr;
    id._12_4_ = 0;
    HttpHeaders::set((HttpHeaders *)local_e0,id,(StringPtr)(__end2->value).content);
  }
  HVar1 = (testCase->request).method;
  local_168 = (testCase->request).path.content.ptr;
  sStack_160 = (testCase->request).path.content.size_;
  Maybe<unsigned_long>::Maybe
            ((Maybe<unsigned_long> *)&__range2_1,&(testCase->request).requestBodySize);
  (**client->_vptr_HttpClient)
            (local_158,client,(ulong)HVar1,local_168,sStack_160,local_e0,&__range2_1);
  Maybe<unsigned_long>::~Maybe((Maybe<unsigned_long> *)&__range2_1);
  this_00 = &(testCase->request).requestBodyParts;
  __end2_1 = Array<kj::StringPtr>::begin(&this_00->super_Array<kj::StringPtr>);
  pSVar6 = Array<kj::StringPtr>::end(&this_00->super_Array<kj::StringPtr>);
  for (; __end2_1 != pSVar6; __end2_1 = __end2_1 + 1) {
    pAVar7 = Own<kj::AsyncOutputStream>::operator->((Own<kj::AsyncOutputStream> *)local_158);
    pcVar8 = StringPtr::begin(__end2_1);
    sVar9 = StringPtr::size(__end2_1);
    (**pAVar7->_vptr_AsyncOutputStream)(&response.body.ptr,pAVar7,pcVar8,sVar9);
    Promise<void>::wait((Promise<void> *)&response.body.ptr,waitScope);
    Promise<void>::~Promise((Promise<void> *)&response.body.ptr);
  }
  Own<kj::AsyncOutputStream>::operator=((Own<kj::AsyncOutputStream> *)local_158,(void *)0x0);
  Promise<kj::HttpClient::Response>::wait
            ((Promise<kj::HttpClient::Response> *)local_1d8,&request.body.ptr);
  pcVar8 = (char *)testCase;
  if ((ulong)(uint)local_1d8._0_4_ != (testCase->response).statusCode) {
    body.content.disposer._7_1_ = _::Debug::shouldLog(ERROR);
    while ((bool)body.content.disposer._7_1_ != false) {
      pcVar8 = "\"failed: expected \" \"response.statusCode == testCase.response.statusCode\"";
      _::Debug::log<char_const(&)[69]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x228,ERROR,
                 "\"failed: expected \" \"response.statusCode == testCase.response.statusCode\"",
                 (char (*) [69])
                 "failed: expected response.statusCode == testCase.response.statusCode");
      body.content.disposer._7_1_ = false;
    }
  }
  limit = Own<kj::AsyncInputStream>::operator->((Own<kj::AsyncInputStream> *)&response.headers);
  MaxValue_::operator_cast_to_unsigned_long((MaxValue_ *)&maxValue);
  AsyncInputStream::readAllText((AsyncInputStream *)&local_208,(uint64_t)limit);
  Promise<kj::String>::wait((Promise<kj::String> *)local_1f8,&local_208);
  Promise<kj::String>::~Promise(&local_208);
  if ((testCase->request).method == HEAD) {
    StringPtr::StringPtr((StringPtr *)local_218,"");
    bVar4 = String::operator==((String *)local_1f8,(StringPtr *)local_218);
    if (!bVar4) {
      local_219 = _::Debug::shouldLog(ERROR);
      while (local_219 != false) {
        _::Debug::log<char_const(&)[28]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                   ,0x22b,ERROR,"\"failed: expected \" \"body == \\\"\\\"\"",
                   (char (*) [28])"failed: expected body == \"\"");
        local_219 = false;
      }
    }
  }
  else {
    strArray<kj::(anonymous_namespace)::InitializeableArray<kj::StringPtr>const&>
              ((String *)local_248,(kj *)&(testCase->response).responseBodyParts,
               (InitializeableArray<kj::StringPtr> *)0x632948,pcVar8);
    StringPtr::StringPtr(&local_230,(String *)local_248);
    bVar4 = String::operator==((String *)local_1f8,&local_230);
    String::~String((String *)local_248);
    if (!bVar4) {
      local_249 = _::Debug::shouldLog(ERROR);
      while (local_249 != false) {
        _::Debug::log<char_const(&)[79],kj::String&>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                   ,0x22d,ERROR,
                   "\"failed: expected \" \"body == kj::strArray(testCase.response.responseBodyParts, \\\"\\\")\", body"
                   ,(char (*) [79])
                    "failed: expected body == kj::strArray(testCase.response.responseBodyParts, \"\")"
                   ,(String *)local_1f8);
        local_249 = false;
      }
    }
  }
  String::~String((String *)local_1f8);
  HttpClient::Response::~Response((Response *)local_1d8);
  HttpClient::Request::~Request((Request *)local_158);
  HttpHeaders::~HttpHeaders((HttpHeaders *)local_e0);
  _::Debug::
  ContextImpl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++:536:3)>
  ::~ContextImpl((ContextImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_compat_http_test_c__:536:3)>
                  *)&headers.ownedStrings.builder.disposer);
  return;
}

Assistant:

void testHttpClient(kj::WaitScope& waitScope, HttpHeaderTable& table,
                    HttpClient& client, const HttpTestCase& testCase) {
  KJ_CONTEXT(testCase.request.raw, testCase.response.raw);

  HttpHeaders headers(table);
  for (auto& header: testCase.request.requestHeaders) {
    headers.set(header.id, header.value);
  }

  auto request = client.request(
      testCase.request.method, testCase.request.path, headers, testCase.request.requestBodySize);
  for (auto& part: testCase.request.requestBodyParts) {
    request.body->write(part.begin(), part.size()).wait(waitScope);
  }
  request.body = nullptr;

  auto response = request.response.wait(waitScope);

  KJ_EXPECT(response.statusCode == testCase.response.statusCode);
  auto body = response.body->readAllText().wait(waitScope);
  if (testCase.request.method == HttpMethod::HEAD) {
    KJ_EXPECT(body == "");
  } else {
    KJ_EXPECT(body == kj::strArray(testCase.response.responseBodyParts, ""), body);
  }
}